

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_msl.cpp
# Opt level: O0

bool __thiscall
spirv_cross::CompilerMSL::is_supported_argument_buffer_type(CompilerMSL *this,SPIRType *type)

{
  bool bVar1;
  bool bVar2;
  bool bVar3;
  bool local_2a;
  bool is_supported_type;
  bool is_storage_image;
  SPIRType *type_local;
  CompilerMSL *this_local;
  
  bVar3 = false;
  if (*(int *)&(type->super_IVariant).field_0xc == 0x10) {
    bVar3 = (type->image).sampled == 2;
  }
  bVar1 = Options::is_ios(&this->msl_options);
  bVar2 = true;
  if (bVar1) {
    bVar2 = (bool)(bVar3 ^ 1);
  }
  bVar3 = type_is_msl_framebuffer_fetch(this,type);
  local_2a = false;
  if (!bVar3) {
    local_2a = bVar2;
  }
  return local_2a;
}

Assistant:

bool CompilerMSL::is_supported_argument_buffer_type(const SPIRType &type) const
{
	// Very specifically, image load-store in argument buffers are disallowed on MSL on iOS.
	// But we won't know when the argument buffer is encoded whether this image will have
	// a NonWritable decoration. So just use discrete arguments for all storage images
	// on iOS.
	bool is_storage_image = type.basetype == SPIRType::Image && type.image.sampled == 2;
	bool is_supported_type = !msl_options.is_ios() || !is_storage_image;
	return !type_is_msl_framebuffer_fetch(type) && is_supported_type;
}